

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::CheckMemoryAccess
          (ValidationState_t *_,Instruction *inst,uint32_t index)

{
  Op OVar1;
  spv_result_t sVar2;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar3;
  DiagnosticStream *pDVar4;
  string local_f60;
  DiagnosticStream local_f40;
  DiagnosticStream local_d68;
  DiagnosticStream local_b90;
  undefined4 local_9b8;
  uint32_t local_9b4;
  spv_result_t error_1;
  uint32_t visible_scope;
  DiagnosticStream local_7d8;
  undefined4 local_600;
  uint32_t local_5fc;
  spv_result_t error;
  uint32_t available_scope;
  DiagnosticStream local_420;
  uint local_244;
  undefined1 local_240 [4];
  uint32_t mask;
  DiagnosticStream local_220;
  tuple<spv::StorageClass&,spv::StorageClass&> local_48 [20];
  pair<spv::StorageClass,_spv::StorageClass> local_34;
  int local_2c;
  StorageClass local_28;
  StorageClass src_sc;
  StorageClass dst_sc;
  uint32_t index_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  src_sc = index;
  _dst_sc = inst;
  inst_local = (Instruction *)_;
  local_34 = GetStorageClass(_,inst);
  std::tie<spv::StorageClass,spv::StorageClass>((StorageClass *)local_48,&local_28);
  std::tuple<spv::StorageClass&,spv::StorageClass&>::operator=(local_48,&local_34);
  this = Instruction::operands(_dst_sc);
  sVar3 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
  if (sVar3 <= src_sc) {
    if ((local_2c != 0x14e5) && (local_28 != PhysicalStorageBuffer)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_220,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_dst_sc)
    ;
    ValidationState_t::VkErrorID_abi_cxx11_
              ((string *)local_240,(ValidationState_t *)inst_local,0x1264,(char *)0x0);
    pDVar4 = DiagnosticStream::operator<<
                       (&local_220,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_240);
    pDVar4 = DiagnosticStream::operator<<
                       (pDVar4,(char (*) [61])
                               "Memory accesses with PhysicalStorageBuffer must use Aligned.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    std::__cxx11::string::~string((string *)local_240);
    DiagnosticStream::~DiagnosticStream(&local_220);
    return __local._4_4_;
  }
  local_244 = Instruction::GetOperandAs<unsigned_int>(_dst_sc,(ulong)src_sc);
  if ((local_244 & 8) != 0) {
    OVar1 = Instruction::opcode(_dst_sc);
    if ((((OVar1 == OpLoad) ||
         (OVar1 = Instruction::opcode(_dst_sc), OVar1 == OpCooperativeMatrixLoadNV)) ||
        (OVar1 = Instruction::opcode(_dst_sc), OVar1 == OpCooperativeMatrixLoadTensorNV)) ||
       (OVar1 = Instruction::opcode(_dst_sc), OVar1 == OpCooperativeMatrixLoadKHR)) {
      ValidationState_t::diag
                (&local_420,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_dst_sc);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_420,
                          (char (*) [52])"MakePointerAvailableKHR cannot be used with OpLoad.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_420);
      return __local._4_4_;
    }
    if ((local_244 & 0x20) == 0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&error,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 _dst_sc);
      pDVar4 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&error,
                          (char (*) [80])
                          "NonPrivatePointerKHR must be specified if MakePointerAvailableKHR is specified."
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error);
      return __local._4_4_;
    }
    local_5fc = GetMakeAvailableScope(_dst_sc,local_244,src_sc);
    sVar2 = ValidateMemoryScope((ValidationState_t *)inst_local,_dst_sc,local_5fc);
    if (sVar2 != SPV_SUCCESS) {
      return sVar2;
    }
    local_600 = 0;
  }
  if ((local_244 & 0x10) != 0) {
    OVar1 = Instruction::opcode(_dst_sc);
    if (((OVar1 == OpStore) ||
        (OVar1 = Instruction::opcode(_dst_sc), OVar1 == OpCooperativeMatrixStoreNV)) ||
       ((OVar1 = Instruction::opcode(_dst_sc), OVar1 == OpCooperativeMatrixStoreKHR ||
        (OVar1 = Instruction::opcode(_dst_sc), OVar1 == OpCooperativeMatrixStoreTensorNV)))) {
      ValidationState_t::diag
                (&local_7d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_dst_sc);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_7d8,
                          (char (*) [51])"MakePointerVisibleKHR cannot be used with OpStore.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_7d8);
      return __local._4_4_;
    }
    if ((local_244 & 0x20) == 0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&error_1,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 _dst_sc);
      pDVar4 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&error_1,
                          (char (*) [43])"NonPrivatePointerKHR must be specified if ");
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [36])"MakePointerVisibleKHR is specified.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_1);
      return __local._4_4_;
    }
    local_9b4 = GetMakeVisibleScope(_dst_sc,local_244,src_sc);
    sVar2 = ValidateMemoryScope((ValidationState_t *)inst_local,_dst_sc,local_9b4);
    if (sVar2 != SPV_SUCCESS) {
      return sVar2;
    }
    local_9b8 = 0;
  }
  if ((local_244 & 0x20) != 0) {
    if (((local_28 != StorageClassUniform) && (local_28 != StorageClassWorkgroup)) &&
       (((local_28 != CrossWorkgroup &&
         (((local_28 != Generic && (local_28 != Image)) && (local_28 != StorageBuffer)))) &&
        (local_28 != PhysicalStorageBuffer)))) {
      ValidationState_t::diag
                (&local_b90,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_dst_sc);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_b90,
                          (char (*) [53])"NonPrivatePointerKHR requires a pointer in Uniform, ");
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [60])
                                 "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer ");
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [17])"storage classes.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_b90);
      return __local._4_4_;
    }
    if (((((local_2c != 0x7fffffff) && (local_2c != 2)) &&
         ((local_2c != 4 && ((local_2c != 5 && (local_2c != 8)))))) && (local_2c != 0xb)) &&
       ((local_2c != 0xc && (local_2c != 0x14e5)))) {
      ValidationState_t::diag
                (&local_d68,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_dst_sc);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_d68,
                          (char (*) [53])"NonPrivatePointerKHR requires a pointer in Uniform, ");
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [60])
                                 "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer ");
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [17])"storage classes.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_d68);
      return __local._4_4_;
    }
  }
  if (((local_244 & 2) == 0) && ((local_2c == 0x14e5 || (local_28 == PhysicalStorageBuffer)))) {
    ValidationState_t::diag(&local_f40,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_dst_sc)
    ;
    ValidationState_t::VkErrorID_abi_cxx11_
              (&local_f60,(ValidationState_t *)inst_local,0x1264,(char *)0x0);
    pDVar4 = DiagnosticStream::operator<<(&local_f40,&local_f60);
    pDVar4 = DiagnosticStream::operator<<
                       (pDVar4,(char (*) [61])
                               "Memory accesses with PhysicalStorageBuffer must use Aligned.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    std::__cxx11::string::~string((string *)&local_f60);
    DiagnosticStream::~DiagnosticStream(&local_f40);
  }
  else {
    __local._4_4_ = SPV_SUCCESS;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t CheckMemoryAccess(ValidationState_t& _, const Instruction* inst,
                               uint32_t index) {
  spv::StorageClass dst_sc, src_sc;
  std::tie(dst_sc, src_sc) = GetStorageClass(_, inst);
  if (inst->operands().size() <= index) {
    // Cases where lack of some operand is invalid
    if (src_sc == spv::StorageClass::PhysicalStorageBuffer ||
        dst_sc == spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(4708)
             << "Memory accesses with PhysicalStorageBuffer must use Aligned.";
    }
    return SPV_SUCCESS;
  }

  const uint32_t mask = inst->GetOperandAs<uint32_t>(index);
  if (mask & uint32_t(spv::MemoryAccessMask::MakePointerAvailableKHR)) {
    if (inst->opcode() == spv::Op::OpLoad ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadTensorNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "MakePointerAvailableKHR cannot be used with OpLoad.";
    }

    if (!(mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR must be specified if "
                "MakePointerAvailableKHR is specified.";
    }

    // Check the associated scope for MakeAvailableKHR.
    const auto available_scope = GetMakeAvailableScope(inst, mask, index);
    if (auto error = ValidateMemoryScope(_, inst, available_scope))
      return error;
  }

  if (mask & uint32_t(spv::MemoryAccessMask::MakePointerVisibleKHR)) {
    if (inst->opcode() == spv::Op::OpStore ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreKHR ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreTensorNV) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "MakePointerVisibleKHR cannot be used with OpStore.";
    }

    if (!(mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR must be specified if "
             << "MakePointerVisibleKHR is specified.";
    }

    // Check the associated scope for MakeVisibleKHR.
    const auto visible_scope = GetMakeVisibleScope(inst, mask, index);
    if (auto error = ValidateMemoryScope(_, inst, visible_scope)) return error;
  }

  if (mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR)) {
    if (dst_sc != spv::StorageClass::Uniform &&
        dst_sc != spv::StorageClass::Workgroup &&
        dst_sc != spv::StorageClass::CrossWorkgroup &&
        dst_sc != spv::StorageClass::Generic &&
        dst_sc != spv::StorageClass::Image &&
        dst_sc != spv::StorageClass::StorageBuffer &&
        dst_sc != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR requires a pointer in Uniform, "
             << "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer "
             << "storage classes.";
    }
    if (src_sc != spv::StorageClass::Max &&
        src_sc != spv::StorageClass::Uniform &&
        src_sc != spv::StorageClass::Workgroup &&
        src_sc != spv::StorageClass::CrossWorkgroup &&
        src_sc != spv::StorageClass::Generic &&
        src_sc != spv::StorageClass::Image &&
        src_sc != spv::StorageClass::StorageBuffer &&
        src_sc != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR requires a pointer in Uniform, "
             << "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer "
             << "storage classes.";
    }
  }

  if (!(mask & uint32_t(spv::MemoryAccessMask::Aligned))) {
    if (src_sc == spv::StorageClass::PhysicalStorageBuffer ||
        dst_sc == spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(4708)
             << "Memory accesses with PhysicalStorageBuffer must use Aligned.";
    }
  }

  return SPV_SUCCESS;
}